

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_parse_url_path(connectdata *conn)

{
  curl_ftpfile cVar1;
  Curl_easy *data;
  undefined8 *puVar2;
  size_t sVar3;
  CURLcode CVar4;
  int iVar5;
  char **ppcVar6;
  char *__dest;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  char *rawPath;
  size_t pathLen;
  char *local_48;
  size_t local_40;
  undefined8 *local_38;
  
  data = conn->data;
  puVar2 = (undefined8 *)(data->req).protop;
  local_48 = (char *)0x0;
  local_40 = 0;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  CVar4 = Curl_urldecode(data,(char *)*puVar2,0,&local_48,&local_40,REJECT_CTRL);
  pcVar7 = local_48;
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  cVar1 = (data->set).ftp_filemethod;
  local_38 = puVar2;
  if (cVar1 == FTPFILE_SINGLECWD) {
    pcVar10 = strrchr(local_48,0x2f);
    if (pcVar10 == (char *)0x0) goto LAB_0011b1a2;
    sVar8 = (long)pcVar10 - (long)pcVar7;
    if (sVar8 == 0) {
      sVar8 = 1;
    }
    ppcVar6 = (char **)(*Curl_ccalloc)(1,8);
    (conn->proto).ftpc.dirs = ppcVar6;
    if (ppcVar6 == (char **)0x0) {
LAB_0011b225:
      (*Curl_cfree)(local_48);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar7 = (char *)(*Curl_ccalloc)(1,sVar8 + 1);
    *(conn->proto).ftpc.dirs = pcVar7;
    pcVar7 = *(conn->proto).ftpc.dirs;
    if (pcVar7 == (char *)0x0) goto LAB_0011b225;
    strncpy(pcVar7,local_48,sVar8);
    (conn->proto).ftpc.dirdepth = 1;
    pcVar7 = pcVar10 + 1;
  }
  else {
    if (cVar1 != FTPFILE_NOCWD) {
      iVar5 = 0;
      pcVar10 = local_48;
      do {
        if (*pcVar10 == '/') {
          iVar5 = iVar5 + 1;
        }
        else if (*pcVar10 == '\0') goto LAB_0011b0e2;
        pcVar10 = pcVar10 + 1;
      } while( true );
    }
    if ((local_40 == 0) || (local_48[local_40 - 1] == '/')) goto LAB_0011b1d1;
  }
LAB_0011b1a7:
  if (*pcVar7 == '\0') goto LAB_0011b1d1;
  pcVar7 = (*Curl_cstrdup)(pcVar7);
  (conn->proto).ftpc.file = pcVar7;
  if ((((data->set).field_0x97b & 0x20) != 0) && (pcVar7 == (char *)0x0)) goto LAB_0011b1e6;
LAB_0011b1f3:
  sVar3 = local_40;
  (conn->proto).ftpc.cwddone = false;
  cVar1 = (data->set).ftp_filemethod;
  if ((cVar1 != FTPFILE_NOCWD) || (*local_48 != '/')) {
    if (((conn->bits).field_0x4 & 0x40) == 0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (conn->proto).ftpc.prevpath;
      if (pcVar10 == (char *)0x0) goto LAB_0011b2cc;
    }
    if (cVar1 == FTPFILE_NOCWD) {
      sVar8 = 0;
    }
    else {
      if (pcVar7 == (char *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = strlen(pcVar7);
      }
      sVar8 = sVar3 - sVar8;
    }
    sVar9 = strlen(pcVar10);
    if ((sVar9 != sVar8) || (iVar5 = strncmp(local_48,pcVar10,sVar8), iVar5 != 0))
    goto LAB_0011b2cc;
    Curl_infof(data,"Request has same path as previous transfer\n");
  }
  (conn->proto).ftpc.cwddone = true;
LAB_0011b2cc:
  (*Curl_cfree)(local_48);
  return CURLE_OK;
LAB_0011b0e2:
  if (0 < iVar5) {
    ppcVar6 = (char **)(*Curl_ccalloc)((size_t)iVar5,8);
    (conn->proto).ftpc.dirs = ppcVar6;
    if (ppcVar6 == (char **)0x0) goto LAB_0011b225;
    pcVar10 = strchr(pcVar7,0x2f);
    if (pcVar10 != (char *)0x0) {
      do {
        sVar8 = (long)pcVar10 - (long)pcVar7;
        if (sVar8 == 0) {
          if ((conn->proto).ftpc.dirdepth == 0) {
            sVar8 = 1;
            goto LAB_0011b12b;
          }
        }
        else {
LAB_0011b12b:
          __dest = (char *)(*Curl_ccalloc)(1,sVar8 + 1);
          if (__dest == (char *)0x0) goto LAB_0011b225;
          strncpy(__dest,pcVar7,sVar8);
          iVar5 = (conn->proto).ftpc.dirdepth;
          (conn->proto).ftpc.dirdepth = iVar5 + 1;
          (conn->proto).ftpc.dirs[iVar5] = __dest;
        }
        pcVar7 = pcVar10 + 1;
        pcVar10 = strchr(pcVar7,0x2f);
      } while (pcVar10 != (char *)0x0);
      goto LAB_0011b1a7;
    }
  }
LAB_0011b1a2:
  if (pcVar7 != (char *)0x0) goto LAB_0011b1a7;
LAB_0011b1d1:
  (conn->proto).ftpc.file = (char *)0x0;
  if (((data->set).field_0x97b & 0x20) != 0) {
LAB_0011b1e6:
    if (*(int *)(local_38 + 2) == 0) {
      Curl_failf(data,"Uploading to a URL without a file name!");
      (*Curl_cfree)(local_48);
      return CURLE_URL_MALFORMAT;
    }
  }
  pcVar7 = (char *)0x0;
  goto LAB_0011b1f3;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(data, ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result)
    return result;

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/')) != NULL) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer\n");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}